

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.h
# Opt level: O0

QTextImageFormat * __thiscall
QTextImageFormat::operator=(QTextImageFormat *this,QTextImageFormat *param_2)

{
  QTextCharFormat *in_RSI;
  QTextImageFormat *in_RDI;
  
  QTextCharFormat::operator=(in_RSI,&in_RDI->super_QTextCharFormat);
  return in_RDI;
}

Assistant:

class Q_GUI_EXPORT QTextImageFormat : public QTextCharFormat
{
public:
    QTextImageFormat();

    bool isValid() const { return isImageFormat(); }

    inline void setName(const QString &name);
    inline QString name() const
    { return stringProperty(ImageName); }

    inline void setWidth(qreal width);
    inline qreal width() const
    { return doubleProperty(ImageWidth); }

    inline void setMaximumWidth(QTextLength maxWidth);
    inline QTextLength maximumWidth() const
    { return lengthProperty(ImageMaxWidth); }

    inline void setHeight(qreal height);
    inline qreal height() const
    { return doubleProperty(ImageHeight); }

    inline void setQuality(int quality);
#if QT_DEPRECATED_SINCE(6, 3)
    QT_DEPRECATED_VERSION_X_6_3("Pass a quality value, the default is 100") inline void setQuality()
    { setQuality(100); }
#endif
    inline int quality() const
    { return intProperty(ImageQuality); }

protected:
    explicit QTextImageFormat(const QTextFormat &format);
    friend class QTextFormat;
    friend Q_GUI_EXPORT QDataStream &operator<<(QDataStream &, const QTextListFormat &);
    friend Q_GUI_EXPORT QDataStream &operator>>(QDataStream &, QTextListFormat &);
}